

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

int SUNMatMatvec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  int iVar2;
  realtype *prVar3;
  realtype *prVar4;
  long *in_RDI;
  realtype *yd;
  realtype *xd;
  realtype *col_j;
  sunindextype j;
  sunindextype i;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  SUNMatrix in_stack_ffffffffffffffc8;
  int local_28;
  int local_24;
  int local_4;
  
  iVar2 = SMCompatible2_Dense(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffb8);
  if (iVar2 == 0) {
    local_4 = -0x2bd;
  }
  else {
    prVar3 = N_VGetArrayPointer((N_Vector)0x1172323);
    prVar4 = N_VGetArrayPointer((N_Vector)0x1172332);
    if (((prVar3 == (realtype *)0x0) || (prVar4 == (realtype *)0x0)) || (prVar3 == prVar4)) {
      local_4 = -0x2be;
    }
    else {
      for (local_24 = 0; local_24 < *(int *)*in_RDI; local_24 = local_24 + 1) {
        prVar4[local_24] = 0.0;
      }
      for (local_28 = 0; local_28 < *(int *)(*in_RDI + 4); local_28 = local_28 + 1) {
        lVar1 = *(long *)(*(long *)(*in_RDI + 0x18) + (long)local_28 * 8);
        for (local_24 = 0; local_24 < *(int *)*in_RDI; local_24 = local_24 + 1) {
          prVar4[local_24] =
               *(double *)(lVar1 + (long)local_24 * 8) * prVar3[local_28] + prVar4[local_24];
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int SUNMatMatvec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  realtype *col_j, *xd, *yd;

  /* Verify that A, x and y are compatible */
  if (!SMCompatible2_Dense(A, x, y))
    return SUNMAT_ILL_INPUT;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return SUNMAT_MEM_FAIL;

  /* Perform operation */
  for (i=0; i<SM_ROWS_D(A); i++)
    yd[i] = ZERO;
  for(j=0; j<SM_COLUMNS_D(A); j++) {
    col_j = SM_COLUMN_D(A,j);
    for (i=0; i<SM_ROWS_D(A); i++)
      yd[i] += col_j[i]*xd[j];
  }
  return SUNMAT_SUCCESS;
}